

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendMessage.cpp
# Opt level: O2

string * __thiscall
SendMessage::execute_abi_cxx11_(string *__return_storage_ptr__,SendMessage *this)

{
  string *__rhs;
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  DIR *__dirp;
  ostream *poVar4;
  allocator local_349;
  pointer local_348;
  string path_to_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string path_of_Directory;
  string receiver_print;
  fstream mail;
  ostream local_230 [512];
  
  lVar3 = std::chrono::_V2::system_clock::now();
  __rhs = &this->receiver;
  std::__cxx11::string::string((string *)&receiver_print,(string *)__rhs);
  std::__cxx11::string::pop_back();
  std::__cxx11::string::string
            ((string *)&path_to_file,(this->super_ServerOperation).MESSAGEDIR,
             (allocator *)&local_320);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mail,
                 &path_to_file,'/');
  std::operator+(&path_of_Directory,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mail,__rhs);
  std::__cxx11::string::~string((string *)&mail);
  std::__cxx11::string::~string((string *)&path_to_file);
  std::__cxx11::string::string
            ((string *)&local_2e0,(this->super_ServerOperation).MESSAGEDIR,&local_349);
  std::operator+(&local_2c0,&local_2e0,'/');
  std::operator+(&local_2a0,&local_2c0,__rhs);
  std::operator+(&local_320,&local_2a0,'/');
  std::__cxx11::to_string(&local_300,lVar3 / 1000000);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mail,
                 &local_320,&local_300);
  std::operator+(&path_to_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mail,".txt");
  std::__cxx11::string::~string((string *)&mail);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  pcVar1 = (this->sender)._M_dataplus._M_p;
  pcVar2 = (this->subject)._M_dataplus._M_p;
  local_348 = (this->message_final)._M_dataplus._M_p;
  __dirp = opendir(path_of_Directory._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    mkdir(path_of_Directory._M_dataplus._M_p,0x1ff);
  }
  else {
    closedir(__dirp);
  }
  std::fstream::fstream(&mail);
  std::fstream::open((char *)&mail,(_Ios_Openmode)path_to_file._M_dataplus._M_p);
  poVar4 = std::operator<<(local_230,"Sender: ");
  std::operator<<(poVar4,pcVar1);
  poVar4 = std::operator<<(local_230,"Subject: ");
  std::operator<<(poVar4,pcVar2);
  std::operator<<(local_230,local_348);
  std::fstream::close();
  std::__cxx11::string::assign((char *)&(this->super_ServerOperation).statusMessage);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"Message sent!\n",(allocator *)&local_320);
  std::fstream::~fstream(&mail);
  std::__cxx11::string::~string((string *)&path_to_file);
  std::__cxx11::string::~string((string *)&path_of_Directory);
  std::__cxx11::string::~string((string *)&receiver_print);
  return __return_storage_ptr__;
}

Assistant:

string SendMessage::execute() {
    std::chrono::milliseconds ms = std::chrono::duration_cast< std::chrono::milliseconds >(
            std::chrono::system_clock::now().time_since_epoch()
    );
    /// save receiver with \n on the end of the string
    string receiver_print = receiver;
    ///delete \n from the end of the string for routing in directories
    receiver.pop_back();
    ///build correct path into directory of the receiver
    string path_of_Directory = string(MESSAGEDIR) + '/' + receiver;
    ///build a unique path to the mail txt file
    string path_to_file = string(MESSAGEDIR) + '/' + receiver + '/' + std::to_string(ms.count()) + ".txt";

    ///convert all strings into char * for functions opendir, mkdir, fprintf
    const char * path = path_of_Directory.c_str();
    const char * path_to_File = path_to_file.c_str();
    const char * sender_char = sender.c_str();
    const char * subject_char = subject.c_str();
    const char * message_final_char = message_final.c_str();

    ///check if the directory is available, if not - create new
    DIR* test = opendir(path);
    if(test == nullptr){
        mkdir(path, 0777);
    }
    else{
        closedir(test);
    }

    ///open the file with the unique path
    fstream mail;
    mail.open(path_to_File, fstream::out);

    ///write all information into the mail-txt file.
    mail << "Sender: " << sender_char;
    mail << "Subject: " << subject_char;
    mail << message_final_char;

    ///close the file
    mail.close();

    statusMessage = SUCCESS;
    return "Message sent!\n";
}